

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall icu_63::TailoredSet::add(TailoredSet *this,UChar32 c)

{
  UBool UVar1;
  undefined1 local_58 [8];
  UnicodeString s;
  UChar32 c_local;
  TailoredSet *this_local;
  
  s.fUnion._52_4_ = c;
  UVar1 = UnicodeString::isEmpty(&this->unreversedPrefix);
  if ((UVar1 == '\0') || (this->suffix != (UnicodeString *)0x0)) {
    UnicodeString::UnicodeString((UnicodeString *)local_58,&this->unreversedPrefix);
    UnicodeString::append((UnicodeString *)local_58,s.fUnion._52_4_);
    if (this->suffix != (UnicodeString *)0x0) {
      UnicodeString::append((UnicodeString *)local_58,this->suffix);
    }
    UnicodeSet::add(this->tailored,(UnicodeString *)local_58);
    UnicodeString::~UnicodeString((UnicodeString *)local_58);
  }
  else {
    UnicodeSet::add(this->tailored,s.fUnion._52_4_);
  }
  return;
}

Assistant:

void
TailoredSet::add(UChar32 c) {
    if(unreversedPrefix.isEmpty() && suffix == NULL) {
        tailored->add(c);
    } else {
        UnicodeString s(unreversedPrefix);
        s.append(c);
        if(suffix != NULL) {
            s.append(*suffix);
        }
        tailored->add(s);
    }
}